

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O3

string * __thiscall
pbrt::DigitPermutation::ToString_abi_cxx11_(string *__return_storage_ptr__,DigitPermutation *this)

{
  int *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  int iVar3;
  long lVar4;
  string ret;
  string s;
  int local_84;
  string local_80;
  string local_60;
  string *local_40;
  int *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  args = &this->nDigits;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_40 = __return_storage_ptr__;
  detail::stringPrintfRecursive<int_const&,int_const&>
            (&local_60,"[ DigitPermitation base: %d nDigits: %d permutations: ",&this->base,args);
  local_84 = 0;
  if (0 < *args) {
    paVar1 = &local_80.field_2;
    local_38 = args;
    do {
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      local_80._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<int&>(&local_80,"[%d] ( ",&local_84);
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      iVar3 = this->base;
      if (0 < iVar3) {
        lVar4 = 0;
        do {
          local_80._M_string_length = 0;
          local_80.field_2._M_local_buf[0] = '\0';
          local_80._M_dataplus._M_p = (pointer)paVar1;
          detail::stringPrintfRecursive<unsigned_short&>
                    (&local_80,"%d",this->permutations + (long)iVar3 * (long)local_84 + lVar4);
          std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,
                            CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                     local_80.field_2._M_local_buf[0]) + 1);
          }
          iVar3 = this->base;
          if ((int)lVar4 != iVar3 + -1) {
            std::__cxx11::string::append((char *)&local_60);
            iVar3 = this->base;
          }
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 < iVar3);
      }
      std::__cxx11::string::append((char *)&local_60);
      local_84 = local_84 + 1;
    } while (local_84 < *local_38);
  }
  psVar2 = local_40;
  (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  std::__cxx11::string::append((char *)psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return psVar2;
}

Assistant:

std::string DigitPermutation::ToString() const {
    std::string s = StringPrintf(
        "[ DigitPermitation base: %d nDigits: %d permutations: ", base, nDigits);
    for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
        s += StringPrintf("[%d] ( ", digitIndex);
        for (int digitValue = 0; digitValue < base; ++digitValue) {
            s += StringPrintf("%d", permutations[digitIndex * base + digitValue]);
            if (digitValue != base - 1)
                s += ", ";
        }
        s += ") ";
    }

    return s + " ]";
}